

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetSourcesCommand.cxx
# Opt level: O0

bool __thiscall
cmTargetSourcesCommand::InitialPass
          (cmTargetSourcesCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  bool bVar1;
  allocator local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmTargetSourcesCommand *this_local;
  
  local_20 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"SOURCES",&local_41);
  bVar1 = cmTargetPropCommandBase::HandleArguments
                    (&this->super_cmTargetPropCommandBase,args,&local_40,NO_FLAGS);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return bVar1;
}

Assistant:

bool cmTargetSourcesCommand::InitialPass(std::vector<std::string> const& args,
                                         cmExecutionStatus&)
{
  return this->HandleArguments(args, "SOURCES");
}